

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Instruction.cc
# Opt level: O2

string * __thiscall
flow::disassemble(string *__return_storage_ptr__,flow *this,Instruction *program,size_t n,
                 string *indent,ConstantPool *cp)

{
  int iVar1;
  Instruction pc;
  size_t ip;
  long lVar2;
  string local_1d8;
  stringstream result;
  ostream local_1a8 [376];
  
  std::__cxx11::stringstream::stringstream((stringstream *)&result);
  pc = 0;
  ip = 0;
  for (lVar2 = 0; this + lVar2 < this + (long)program * 8; lVar2 = lVar2 + 8) {
    std::operator<<(local_1a8,(string *)n);
    disassemble_abi_cxx11_(&local_1d8,*(flow **)(this + pc * 8),pc,ip,(size_t)indent,cp);
    std::operator<<(local_1a8,(string *)&local_1d8);
    std::__cxx11::string::~string((string *)&local_1d8);
    std::operator<<(local_1a8,'\n');
    iVar1 = getStackChange(*(Instruction *)(this + pc * 8));
    ip = ip + (long)iVar1;
    pc = pc + 1;
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream((stringstream *)&result);
  return __return_storage_ptr__;
}

Assistant:

std::string disassemble(const Instruction* program,
                        size_t n,
                        const std::string& indent,
                        const ConstantPool* cp) {
  std::stringstream result;
  size_t i = 0;
  size_t sp = 0;
  for (const Instruction* pc = program; pc < program + n; ++pc) {
    result << indent;
    result << disassemble(*pc, i++, sp, cp);
    result << '\n';
    sp += getStackChange(*pc);
  }
  return result.str();
}